

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  size_t sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  pointer pbVar6;
  pointer pcVar7;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *pvVar8;
  ConfigBase *pCVar9;
  byte bVar10;
  char cVar11;
  char cVar12;
  bool bVar13;
  char cVar14;
  bool bVar15;
  int iVar16;
  istream *piVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var21;
  undefined8 uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  pointer pCVar24;
  _Alloc_hider _Var25;
  undefined8 in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_4;
  size_t start;
  pointer pCVar26;
  string l2;
  string item;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *output;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  string line;
  string currentSection;
  string name;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it_1;
  string buffer;
  string previousSection;
  string line_sep_chars;
  string local_2e8;
  undefined1 local_2c8 [12];
  uint local_2bc;
  string local_2b8;
  ConfigBase *local_298;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *local_290;
  ulong local_288;
  uint local_27c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  uint local_218;
  uint local_214;
  int local_210;
  int local_20c;
  string local_208;
  string local_1e8;
  undefined1 *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  pointer local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined4 local_194;
  string local_190;
  undefined1 *local_170;
  char *local_168;
  undefined1 local_160 [16];
  string local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  char *local_f0;
  undefined8 local_e8;
  char local_e0;
  char local_df;
  char local_de;
  undefined1 local_dd;
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0 [7];
  
  local_238._M_allocated_capacity = (size_type)&local_228;
  local_238._8_8_ = 0;
  local_228._M_local_buf[0] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_290 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"default","");
  local_170 = local_160;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"default","");
  (local_290->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_290->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_290->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = this->arrayStart;
  local_218 = (uint)cVar1;
  cVar11 = this->arrayEnd;
  local_20c = (int)cVar11;
  if (cVar11 == ']' && cVar1 == '[') {
    uVar22 = CONCAT71((int7)((ulong)in_R8 >> 8),this->arraySeparator == ',');
  }
  else if ((local_218 & 0xdf) == 0) {
    if (cVar1 == cVar11) {
      uVar22 = 0;
      local_20c = 0x5d;
      bVar10 = 1;
      local_218 = 0x5b;
      goto LAB_00112d2e;
    }
    uVar22 = 0;
  }
  else {
    uVar22 = 0;
  }
  bVar10 = 0;
LAB_00112d2e:
  bVar2 = this->arraySeparator;
  local_214 = 0x2c;
  if (bVar2 != 0x20) {
    local_214 = (uint)bVar2;
  }
  if (bVar10 == 0) {
    local_214 = (uint)bVar2;
  }
  local_e0 = this->parentSeparatorChar;
  local_df = this->commentChar;
  local_de = this->valueDelimiter;
  local_f0 = &local_e0;
  local_e8 = 3;
  local_dd = 0;
  local_194 = (undefined4)CONCAT71((int7)((ulong)uVar22 >> 8),(byte)uVar22 | bVar10);
  local_210 = 0;
  local_2bc = 0;
  local_298 = this;
  do {
    cVar1 = (char)input;
    cVar11 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
    piVar17 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                        (input,(string *)&local_190,cVar11);
    if (((byte)piVar17[*(long *)(*(long *)piVar17 + -0x18) + 0x20] & 5) != 0) {
      iVar16 = ::std::__cxx11::string::compare((char *)&local_208);
      if (iVar16 != 0) {
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        local_1e8._M_string_length = 0;
        local_1e8.field_2._M_local_buf[0] = '\0';
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>(local_290);
        detail::generate_parents
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2e8,&local_208,&local_1e8,local_298->parentSeparatorChar);
        pvVar8 = local_290;
        pCVar24 = (local_290->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_2b8.field_2._M_allocated_capacity =
             (size_type)
             pCVar24[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2b8._M_dataplus._M_p =
             (pointer)pCVar24[-1].parents.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_2b8._M_string_length =
             (size_type)
             pCVar24[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pCVar24[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2e8._M_dataplus._M_p;
        pCVar24[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2e8._M_string_length;
        pCVar24[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_2e8.field_2._M_allocated_capacity;
        local_2e8._M_dataplus._M_p = (pointer)0x0;
        local_2e8._M_string_length = 0;
        local_2e8.field_2._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2e8);
        pCVar24 = (pvVar8->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pCVar24[-1].name,0,(char *)pCVar24[-1].name._M_string_length,0x1442dc);
        pCVar24 = (pvVar8->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar19 = (long)pCVar24[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)pCVar24[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        while (0x20 < uVar19) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    (pvVar8,pCVar24 + -1);
          pCVar24 = (pvVar8->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          pbVar6 = pCVar24[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pCVar24[-1].parents.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar6 + -1;
          pcVar7 = pbVar6[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar7 != &pbVar6[-1].field_2) {
            operator_delete(pcVar7);
          }
          pCVar24 = (local_290->
                    super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          pvVar8 = local_290;
          uVar19 = (long)pCVar24[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pCVar24[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0);
      }
      if (local_170 != local_160) {
        operator_delete(local_170);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_allocated_capacity != &local_228) {
        operator_delete((void *)local_238._M_allocated_capacity);
      }
      return local_290;
    }
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    detail::trim_copy(&local_2b8,&local_190);
    ::std::__cxx11::string::operator=((string *)local_238._M_local_buf,(string *)&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
    if (2 < (ulong)local_238._8_8_) {
      iVar16 = ::std::__cxx11::string::compare((ulong)&local_238,0,(char *)0x3);
      if ((iVar16 == 0) ||
         (iVar16 = ::std::__cxx11::string::compare((ulong)&local_238,0,(char *)0x3), iVar16 == 0)) {
        cVar11 = *(char *)local_238._M_allocated_capacity;
        do {
          cVar12 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
          piVar17 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                              (input,(string *)local_238._M_local_buf,cVar12);
          if (((byte)piVar17[*(long *)(*(long *)piVar17 + -0x18) + 0x20] & 5) != 0) break;
          local_2b8._M_dataplus._M_p = (pointer)(local_238._8_8_ + local_238._M_allocated_capacity);
          local_2e8._M_dataplus._M_p = (pointer)local_238._M_allocated_capacity;
          ::std::
          __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    (&local_258,&local_2b8,&local_2e8);
          local_238._8_8_ = (long)local_258._M_dataplus._M_p - local_238._0_8_;
          *local_258._M_dataplus._M_p = '\0';
          _Var21 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                             ();
          if ((char *)(local_238._8_8_ + local_238._M_allocated_capacity) == _Var21._M_current) {
            local_238._8_8_ = 0;
            *(char *)local_238._M_allocated_capacity = '\0';
          }
          else {
            ::std::__cxx11::string::_M_erase((ulong)&local_238,0);
          }
        } while (((((ulong)local_238._8_8_ < 3) ||
                  (((char *)(local_238._M_allocated_capacity - 1))[local_238._8_8_] != cVar11)) ||
                 (((char *)(local_238._M_allocated_capacity - 2))[local_238._8_8_] != cVar11)) ||
                (((char *)(local_238._M_allocated_capacity - 3))[local_238._8_8_] != cVar11));
      }
      else {
        cVar11 = *(char *)local_238._M_allocated_capacity;
        if ((cVar11 != '#') && (cVar11 != ';')) {
          if ((cVar11 == '[') &&
             (((char *)(local_238._M_allocated_capacity - 1))[local_238._8_8_] == ']')) {
            iVar16 = ::std::__cxx11::string::compare((char *)&local_208);
            if (iVar16 != 0) {
              std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                        (local_290);
              detail::generate_parents
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2e8,&local_208,&local_1e8,local_298->parentSeparatorChar);
              pvVar8 = local_290;
              pCVar24 = (local_290->
                        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              local_2b8.field_2._M_allocated_capacity =
                   (size_type)
                   pCVar24[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_2b8._M_dataplus._M_p =
                   (pointer)pCVar24[-1].parents.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              local_2b8._M_string_length =
                   (size_type)
                   pCVar24[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              pCVar24[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2e8._M_dataplus._M_p;
              pCVar24[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2e8._M_string_length;
              pCVar24[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_2e8.field_2._M_allocated_capacity;
              local_2e8._M_dataplus._M_p = (pointer)0x0;
              local_2e8._M_string_length = 0;
              local_2e8.field_2._M_allocated_capacity = 0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_2b8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_2e8);
              pCVar24 = (pvVar8->
                        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&pCVar24[-1].name,0,(char *)pCVar24[-1].name._M_string_length,
                         0x1442dc);
            }
            ::std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_238);
            ::std::__cxx11::string::operator=((string *)&local_208,(string *)&local_2b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p);
            }
            if ((((char *)0x1 < local_208._M_string_length) && (*local_208._M_dataplus._M_p == '['))
               && ((local_208._M_dataplus._M_p + -1)[local_208._M_string_length] == ']')) {
              ::std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_208);
              ::std::__cxx11::string::operator=((string *)&local_208,(string *)&local_2b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p);
              }
            }
            local_1b8 = &local_1a8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b8,local_208._M_dataplus._M_p,
                       (char *)(local_208._M_string_length + (long)local_208._M_dataplus._M_p));
            ::std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                      (local_1b8,
                       (char *)((long)&(local_1b0->_M_dataplus)._M_p +
                               (long)(_Alloc_hider *)local_1b8),local_1b8);
            if (local_1b8 == &local_1a8) {
              local_2b8.field_2._8_8_ = local_1a8._8_8_;
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            }
            else {
              local_2b8._M_dataplus._M_p = (pointer)local_1b8;
            }
            local_2b8.field_2._M_allocated_capacity._1_7_ = local_1a8._M_allocated_capacity._1_7_;
            local_2b8.field_2._M_local_buf[0] = local_1a8._M_local_buf[0];
            local_2b8._M_string_length = (size_type)local_1b0;
            local_1b0 = (pointer)0x0;
            local_1a8._M_local_buf[0] = '\0';
            local_1b8 = &local_1a8;
            iVar16 = ::std::__cxx11::string::compare((char *)&local_2b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p);
            }
            if (local_1b8 != &local_1a8) {
              operator_delete(local_1b8);
            }
            if (iVar16 == 0) {
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_208,0,(char *)local_208._M_string_length,0x144524);
            }
            else {
              detail::checkParentSegments(local_290,&local_208,local_298->parentSeparatorChar);
            }
            if (((char *)local_208._M_string_length == local_168) &&
               (((char *)local_208._M_string_length == (char *)0x0 ||
                (iVar16 = bcmp(local_208._M_dataplus._M_p,local_170,local_208._M_string_length),
                iVar16 == 0)))) {
              local_210 = local_210 + 1;
              local_2bc = 0;
            }
            else {
              local_210 = 0;
              ::std::__cxx11::string::_M_assign((string *)&local_170);
              local_2bc = 0;
            }
          }
          else if (cVar11 != local_298->commentChar) {
            lVar18 = ::std::__cxx11::string::find_first_of(local_238._M_local_buf,0x14797b,0);
            if ((lVar18 != -1) && (local_238._8_8_ != 0)) {
              start = 0;
              do {
                bVar10 = *(byte *)(local_238._M_allocated_capacity + start);
                if ((bVar10 - 0x22 < 0x3f) &&
                   ((0x4000000000000021U >> ((ulong)(bVar10 - 0x22) & 0x3f) & 1) != 0)) {
                  start = detail::close_sequence((string *)&local_238,start,bVar10);
LAB_0011325e:
                  start = start + 1;
                }
                else {
                  if ((bVar10 == local_298->valueDelimiter) || (bVar10 == local_298->commentChar))
                  break;
                  if (((bVar10 == 9) || (bVar10 == 0x20)) ||
                     (bVar10 == local_298->parentSeparatorChar)) goto LAB_0011325e;
                  start = ::std::__cxx11::string::find_first_of
                                    (local_238._M_local_buf,(ulong)local_f0,start);
                }
              } while (start < (ulong)local_238._8_8_);
            }
            pCVar9 = local_298;
            cVar11 = (char)&local_238;
            uVar19 = ::std::__cxx11::string::find
                               (cVar11,(ulong)(uint)(int)local_298->valueDelimiter);
            uVar20 = ::std::__cxx11::string::find(cVar11,(ulong)(uint)(int)pCVar9->commentChar);
            if (uVar19 == 0xffffffffffffffff || uVar20 < uVar19) {
              ::std::__cxx11::string::substr((ulong)&local_2e8,(ulong)&local_238);
              detail::trim_copy(&local_2b8,&local_2e8);
              ::std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_2b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p);
              }
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"true","");
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_278,&local_2b8,&local_298);
            }
            else {
              ::std::__cxx11::string::substr((ulong)&local_2e8,(ulong)&local_238);
              detail::trim_copy(&local_2b8,&local_2e8);
              ::std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_2b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p);
              }
              ::std::__cxx11::string::substr((ulong)&local_2e8,(ulong)&local_238);
              detail::trim_copy(&local_2b8,&local_2e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p);
              }
              iVar16 = ::std::__cxx11::string::compare((ulong)&local_2b8,0,(char *)0x3);
              cVar11 = (char)&local_2b8;
              if (iVar16 == 0) {
LAB_00113589:
                cVar12 = *local_2b8._M_dataplus._M_p;
                ::std::__cxx11::string::substr((ulong)&local_2e8,(ulong)&local_190);
                ::std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                  operator_delete(local_2e8._M_dataplus._M_p);
                }
                _Var21 = ::std::
                         __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                   ();
                _Var25._M_p = local_2b8._M_dataplus._M_p;
                if (local_2b8._M_dataplus._M_p + (long)(_Alloc_hider *)local_2b8._M_string_length ==
                    _Var21._M_current) {
                  local_2b8._M_string_length = 0;
                  *local_2b8._M_dataplus._M_p = '\0';
                }
                else {
                  ::std::__cxx11::string::_M_erase((ulong)&local_2b8,0);
                }
                ::std::__cxx11::string::erase((ulong)&local_2b8,0);
                if ((pointer)local_2b8._M_string_length == (pointer)0x0) {
LAB_001139cc:
                  local_288 = 0;
LAB_001139d5:
                  bVar13 = true;
                }
                else {
                  _Var25._M_p = local_2b8._M_dataplus._M_p;
                  if ((local_2b8._M_dataplus._M_p + -1)[local_2b8._M_string_length] == '\\') {
                    uVar22 = ::std::__cxx11::string::pop_back();
                    local_288 = CONCAT71((int7)((ulong)uVar22 >> 8),1);
                    goto LAB_001139d5;
                  }
                  if ((((local_2b8._M_dataplus._M_p + -1)[local_2b8._M_string_length] != cVar12 ||
                        local_2b8._M_string_length < (pointer)0x3) ||
                      ((local_2b8._M_dataplus._M_p + -2)[local_2b8._M_string_length] != cVar12)) ||
                     ((local_2b8._M_dataplus._M_p + -3)[local_2b8._M_string_length] != cVar12))
                  goto LAB_001139cc;
                  ::std::__cxx11::string::pop_back();
                  ::std::__cxx11::string::pop_back();
                  ::std::__cxx11::string::pop_back();
                  local_288 = 0;
                  bVar13 = false;
                  if (cVar12 == '\"') {
                    detail::remove_escaped_characters(&local_2e8,&local_2b8);
                    ::std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_2e8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                      operator_delete(local_2e8._M_dataplus._M_p);
                    }
                    local_288 = 0;
                    bVar13 = false;
                  }
                }
                local_27c = (uint)CONCAT71((int7)((ulong)_Var25._M_p >> 8),1);
                do {
                  if (!bVar13) break;
                  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
                  local_2e8._M_string_length = 0;
                  local_2e8.field_2._M_allocated_capacity =
                       local_2e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  cVar14 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
                  piVar17 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      (input,(string *)&local_2e8,cVar14);
                  uVar4 = *(uint *)(piVar17 + *(long *)(*(long *)piVar17 + -0x18) + 0x20);
                  bVar13 = true;
                  if ((uVar4 & 5) == 0) {
                    ::std::__cxx11::string::_M_assign((string *)local_238._M_local_buf);
                    local_258._M_dataplus._M_p =
                         (pointer)(local_238._8_8_ + local_238._M_allocated_capacity);
                    local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_238._M_allocated_capacity;
                    ::std::
                    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                              (&local_1c8,&local_258,&local_1c0);
                    local_238._8_8_ = (long)local_1c8 - local_238._0_8_;
                    *local_1c8 = 0;
                    if ((((ulong)local_238._8_8_ < 3) ||
                        (((char *)(local_238._M_allocated_capacity - 1))[local_238._8_8_] != cVar12)
                        ) || ((((char *)(local_238._M_allocated_capacity - 2))[local_238._8_8_] !=
                               cVar12 ||
                              (((char *)(local_238._M_allocated_capacity - 3))[local_238._8_8_] !=
                               cVar12)))) {
                      if ((local_288 & 1) == 0) {
                        if (((local_27c & 1) == 0) ||
                           ((pointer)local_2b8._M_string_length != (pointer)0x0)) {
                          ::std::__cxx11::string::push_back(cVar11);
                        }
                      }
                      else {
                        local_258._M_dataplus._M_p =
                             local_2e8._M_dataplus._M_p + local_2e8._M_string_length;
                        local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2e8._M_dataplus._M_p;
                        ::std::
                        __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                  (&local_1c8,&local_258,&local_1c0);
                        local_2e8._M_string_length =
                             (size_type)(local_1c8 + -(long)local_2e8._M_dataplus._M_p);
                        *local_1c8 = 0;
                        _Var21 = ::std::
                                 __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                           ();
                        if (local_2e8._M_dataplus._M_p + local_2e8._M_string_length ==
                            _Var21._M_current) {
                          local_2e8._M_string_length = 0;
                          *local_2e8._M_dataplus._M_p = '\0';
                        }
                        else {
                          ::std::__cxx11::string::_M_erase((ulong)&local_2e8,0);
                        }
                      }
                      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_2e8._M_string_length ==
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0) ||
                         ((local_2e8._M_dataplus._M_p + -1)[local_2e8._M_string_length] != '\\')) {
                        local_288 = 0;
                      }
                      else {
                        uVar22 = ::std::__cxx11::string::pop_back();
                        local_288 = CONCAT71((int7)((ulong)uVar22 >> 8),1);
                      }
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_2b8,(ulong)local_2e8._M_dataplus._M_p);
                      local_27c = 0;
                    }
                    else {
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      if ((local_288 & 1) == 0) {
                        if (((local_27c & 1) == 0) ||
                           ((pointer)local_2b8._M_string_length != (pointer)0x0)) {
                          ::std::__cxx11::string::push_back(cVar11);
                        }
                      }
                      else {
                        _Var21 = ::std::
                                 __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                           ();
                        if ((char *)(local_238._8_8_ + local_238._M_allocated_capacity) ==
                            _Var21._M_current) {
                          local_238._8_8_ = 0;
                          *(char *)local_238._M_allocated_capacity = '\0';
                        }
                        else {
                          ::std::__cxx11::string::_M_erase((ulong)&local_238,0);
                        }
                      }
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_2b8,local_238._M_allocated_capacity);
                      if (((pointer)local_2b8._M_string_length != (pointer)0x0) &&
                         ((local_2b8._M_dataplus._M_p + -1)[local_2b8._M_string_length] == '\n')) {
                        ::std::__cxx11::string::pop_back();
                      }
                      if (cVar12 == '\"') {
                        detail::remove_escaped_characters(&local_258,&local_2b8);
                        ::std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_258)
                        ;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_258._M_dataplus._M_p != &local_258.field_2) {
                          operator_delete(local_258._M_dataplus._M_p);
                        }
                      }
                      local_27c = 0;
                      bVar13 = false;
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                    operator_delete(local_2e8._M_dataplus._M_p);
                  }
                } while ((uVar4 & 5) == 0);
                local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2e8,local_2b8._M_dataplus._M_p,
                           local_2b8._M_dataplus._M_p +
                           (long)(_Alloc_hider *)local_2b8._M_string_length);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_278,&local_2e8,local_2c8);
LAB_00113d5c:
                paVar23 = &local_2e8.field_2;
                uVar22 = local_2e8._M_dataplus._M_p;
              }
              else {
                iVar16 = ::std::__cxx11::string::compare((ulong)&local_2b8,0,(char *)0x3);
                if (uVar20 == 0xffffffffffffffff || iVar16 == 0) {
                  if (iVar16 == 0) goto LAB_00113589;
                }
                else {
                  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_110,local_2b8._M_dataplus._M_p,
                             local_2b8._M_dataplus._M_p +
                             (long)(_Alloc_hider *)local_2b8._M_string_length);
                  detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_258,&local_110,local_298->commentChar);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_110._M_dataplus._M_p != &local_110.field_2) {
                    operator_delete(local_110._M_dataplus._M_p);
                  }
                  detail::trim_copy(&local_2e8,(string *)local_258._M_dataplus._M_p);
                  ::std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_2e8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                    operator_delete(local_2e8._M_dataplus._M_p);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_258);
                }
                if ((local_2b8._M_string_length < (pointer)0x2) ||
                   (local_218 != (int)*local_2b8._M_dataplus._M_p)) {
                  if ((char)local_194 == '\0') {
LAB_001138cb:
                    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_2e8,local_2b8._M_dataplus._M_p,
                               local_2b8._M_dataplus._M_p +
                               (long)(_Alloc_hider *)local_2b8._M_string_length);
                    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_assign_aux<std::__cxx11::string_const*>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_278,&local_2e8,local_2c8);
                    goto LAB_00113d5c;
                  }
                  cVar1 = (char)local_214;
                  lVar18 = ::std::__cxx11::string::find(cVar11,(ulong)(uint)(int)(char)local_214);
                  if (lVar18 == -1) {
                    lVar18 = ::std::__cxx11::string::find(cVar11,0x20);
                    if (lVar18 == -1) goto LAB_001138cb;
                    local_130._M_allocated_capacity = (size_type)&local_120;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_130,local_2b8._M_dataplus._M_p,
                               local_2b8._M_dataplus._M_p +
                               (long)(_Alloc_hider *)local_2b8._M_string_length);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_258,(string *)&local_130,'\0');
                    local_2e8.field_2._M_allocated_capacity =
                         (size_type)
                         local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_2e8._M_string_length =
                         (size_type)
                         local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    local_2e8._M_dataplus._M_p =
                         (pointer)local_278.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)local_258.field_2._M_allocated_capacity;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258._M_dataplus._M_p;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._M_string_length
                    ;
                    local_258._M_dataplus._M_p = (pointer)0x0;
                    local_258._M_string_length = 0;
                    local_258.field_2._M_allocated_capacity = 0;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_2e8);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_258);
                    paVar23 = &local_120;
                    uVar22 = local_130._M_allocated_capacity;
                  }
                  else {
                    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_150,local_2b8._M_dataplus._M_p,
                               local_2b8._M_dataplus._M_p +
                               (long)(_Alloc_hider *)local_2b8._M_string_length);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_258,&local_150,cVar1);
                    local_2e8.field_2._M_allocated_capacity =
                         (size_type)
                         local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_2e8._M_string_length =
                         (size_type)
                         local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    local_2e8._M_dataplus._M_p =
                         (pointer)local_278.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)local_258.field_2._M_allocated_capacity;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258._M_dataplus._M_p;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._M_string_length
                    ;
                    local_258._M_dataplus._M_p = (pointer)0x0;
                    local_258._M_string_length = 0;
                    local_258.field_2._M_allocated_capacity = 0;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_2e8);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_258);
                    paVar23 = &local_150.field_2;
                    uVar22 = local_150._M_dataplus._M_p;
                  }
                }
                else {
                  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
                  local_2e8._M_string_length = 0;
                  local_2e8.field_2._M_allocated_capacity =
                       local_2e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  while (local_20c != (local_2b8._M_dataplus._M_p + -1)[local_2b8._M_string_length])
                  {
                    cVar11 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1
                                              );
                    piVar17 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                        (input,(string *)&local_2e8,cVar11);
                    if (((byte)piVar17[*(long *)(*(long *)piVar17 + -0x18) + 0x20] & 5) != 0) break;
                    local_258._M_dataplus._M_p =
                         local_2e8._M_dataplus._M_p + local_2e8._M_string_length;
                    local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2e8._M_dataplus._M_p;
                    ::std::
                    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                              (&local_1c8,&local_258,&local_1c0);
                    local_2e8._M_string_length =
                         (size_type)(local_1c8 + -(long)local_2e8._M_dataplus._M_p);
                    *local_1c8 = 0;
                    _Var21 = ::std::
                             __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                       ();
                    if (local_2e8._M_dataplus._M_p + local_2e8._M_string_length == _Var21._M_current
                       ) {
                      local_2e8._M_string_length = 0;
                      *local_2e8._M_dataplus._M_p = '\0';
                    }
                    else {
                      ::std::__cxx11::string::_M_erase((ulong)&local_2e8,0);
                    }
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_2b8,(ulong)local_2e8._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                    operator_delete(local_2e8._M_dataplus._M_p);
                  }
                  if (local_20c == (local_2b8._M_dataplus._M_p + -1)[local_2b8._M_string_length]) {
                    ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_2b8);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_258,(string *)&local_b0,(char)local_214);
                    local_2e8.field_2._M_allocated_capacity =
                         (size_type)
                         local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_2e8._M_string_length =
                         (size_type)
                         local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    local_2e8._M_dataplus._M_p =
                         (pointer)local_278.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)local_258.field_2._M_allocated_capacity;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258._M_dataplus._M_p;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._M_string_length
                    ;
                    local_258._M_dataplus._M_p = (pointer)0x0;
                    local_258._M_string_length = 0;
                    local_258.field_2._M_allocated_capacity = 0;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_2e8);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_258);
                    paVar23 = local_a0;
                    uVar22 = local_b0._M_allocated_capacity;
                  }
                  else {
                    ::std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_2b8);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_258,&local_d0,(char)local_214);
                    local_2e8.field_2._M_allocated_capacity =
                         (size_type)
                         local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_2e8._M_string_length =
                         (size_type)
                         local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    local_2e8._M_dataplus._M_p =
                         (pointer)local_278.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)local_258.field_2._M_allocated_capacity;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258._M_dataplus._M_p;
                    local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._M_string_length
                    ;
                    local_258._M_dataplus._M_p = (pointer)0x0;
                    local_258._M_string_length = 0;
                    local_258.field_2._M_allocated_capacity = 0;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_2e8);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_258);
                    paVar23 = &local_d0.field_2;
                    uVar22 = local_d0._M_dataplus._M_p;
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar22 != paVar23) {
                operator_delete((void *)uVar22);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p);
            }
            local_2e8._M_dataplus._M_p = (pointer)0x0;
            local_2e8._M_string_length = 0;
            local_2e8.field_2._M_allocated_capacity = 0;
            detail::generate_parents
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_258,&local_208,&local_1e8,local_298->parentSeparatorChar);
            local_2b8.field_2._M_allocated_capacity = local_2e8.field_2._M_allocated_capacity;
            local_2b8._M_string_length = local_2e8._M_string_length;
            local_2b8._M_dataplus._M_p = local_2e8._M_dataplus._M_p;
            local_2e8.field_2._M_allocated_capacity = local_258.field_2._M_allocated_capacity;
            local_2e8._M_dataplus._M_p = local_258._M_dataplus._M_p;
            local_2e8._M_string_length = local_258._M_string_length;
            local_258._M_dataplus._M_p = (pointer)0x0;
            local_258._M_string_length = 0;
            local_258.field_2._M_allocated_capacity = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_2b8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_258);
            detail::process_quoted_string(&local_1e8,'\"','\'');
            pbVar6 = local_278.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_278.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start; pCVar9 = local_298,
                _Var25._M_p = local_2e8._M_dataplus._M_p,
                paVar23 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pbVar6; paVar23 = paVar23 + 2) {
              detail::process_quoted_string
                        ((string *)paVar23,local_298->stringQuote,local_298->literalQuote);
            }
            if ((ulong)((long)(local_2e8._M_string_length - (long)local_2e8._M_dataplus._M_p) >> 5)
                <= (ulong)local_298->maximumLayers) {
              sVar5 = (local_298->configSection)._M_string_length;
              if (sVar5 == 0 || (local_2bc & 1) != 0) {
LAB_00113e95:
                pCVar24 = (local_290->
                          super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pCVar26 = (local_290->
                          super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
                if (pCVar24 == pCVar26) {
LAB_00114061:
                  if (pCVar26 != pCVar24) {
                    pbVar6 = (pCVar26->inputs).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    if (((((0x20 < (ulong)((long)pbVar6 -
                                          (long)(pCVar26->inputs).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)) &&
                          (0x20 < (ulong)((long)local_278.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_278.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start))) ||
                         (local_298->allowMultipleDuplicateFields == true)) &&
                        ((pbVar6[-1]._M_string_length != 0 &&
                         (*(size_type *)
                           ((long)local_278.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8) != 0)))) &&
                       ((iVar16 = ::std::__cxx11::string::compare((char *)(pbVar6 + -1)),
                        iVar16 != 0 &&
                        (iVar16 = ::std::__cxx11::string::compare
                                            ((char *)local_278.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                        iVar16 != 0)))) {
                      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const(&)[3]>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&pCVar26->inputs,(char (*) [3])"%%");
                      pCVar26->multiline = true;
                    }
                    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &pCVar26->inputs,
                               (pCVar26->inputs).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               local_278.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               local_278.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                    goto LAB_001141c0;
                  }
                }
                else {
                  bVar13 = local_298->allowMultipleDuplicateFields;
                  pCVar24 = pCVar26;
                  do {
                    pCVar26 = pCVar24 + -1;
                    __first1 = (pCVar26->parents).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    __last1 = pCVar24[-1].parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    if ((((long)__last1 - (long)__first1 ==
                          local_2e8._M_string_length - (long)local_2e8._M_dataplus._M_p) &&
                        (bVar15 = ::std::__equal<false>::
                                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                            (__first1,__last1,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_2e8._M_dataplus._M_p), bVar15)) &&
                       ((sVar5 = pCVar24[-1].name._M_string_length,
                        sVar5 == local_1e8._M_string_length &&
                        ((sVar5 == 0 ||
                         (iVar16 = bcmp(pCVar24[-1].name._M_dataplus._M_p,local_1e8._M_dataplus._M_p
                                        ,sVar5), iVar16 == 0)))))) {
                      pCVar24 = (local_290->
                                super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
                      goto LAB_00114061;
                    }
                  } while ((pCVar26 !=
                            (local_290->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_start) &&
                          (pCVar24 = pCVar26, bVar13 != false));
                }
                pvVar8 = local_290;
                std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                          (local_290);
                pCVar24 = (pvVar8->
                          super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
                local_2b8.field_2._M_allocated_capacity =
                     (size_type)
                     pCVar24[-1].parents.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_2b8._M_dataplus._M_p =
                     (pointer)pCVar24[-1].parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                local_2b8._M_string_length =
                     (size_type)
                     pCVar24[-1].parents.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                pCVar24[-1].parents.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2e8._M_dataplus._M_p;
                pCVar24[-1].parents.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2e8._M_string_length;
                pCVar24[-1].parents.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)local_2e8.field_2._M_allocated_capacity;
                local_2e8._M_dataplus._M_p = (pointer)0x0;
                local_2e8._M_string_length = 0;
                local_2e8.field_2._M_allocated_capacity = 0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2b8);
                ::std::__cxx11::string::operator=
                          ((string *)
                           &(pvVar8->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_finish[-1].name,(string *)&local_1e8)
                ;
                pCVar24 = (pvVar8->
                          super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
                local_2b8.field_2._M_allocated_capacity =
                     (size_type)
                     pCVar24[-1].inputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_2b8._M_dataplus._M_p =
                     (pointer)pCVar24[-1].inputs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                local_2b8._M_string_length =
                     (size_type)
                     pCVar24[-1].inputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                pCVar24[-1].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_278.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                pCVar24[-1].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_278.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                pCVar24[-1].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_278.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_278.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_278.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_278.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2b8);
              }
              else {
                if (((local_2e8._M_dataplus._M_p != (pointer)local_2e8._M_string_length) &&
                    (*(size_type *)((long)local_2e8._M_dataplus._M_p + 8) == sVar5)) &&
                   (iVar16 = bcmp(((_Alloc_hider *)local_2e8._M_dataplus._M_p)->_M_p,
                                  (local_298->configSection)._M_dataplus._M_p,sVar5), iVar16 == 0))
                {
                  sVar3 = pCVar9->configIndex;
                  if (local_210 == sVar3 || sVar3 < 0) {
                    local_2bc = (uint)CONCAT71((uint7)(uint3)(int3)(char)((ushort)sVar3 >> 8),1);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_2e8,(iterator)_Var25._M_p);
                    goto LAB_00113e95;
                  }
                }
                local_2bc = 0;
              }
            }
LAB_001141c0:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_2e8);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278);
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string buffer;
    std::string currentSection = "default";
    std::string previousSection = "default";
    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    bool inSection{false};
    bool inMLineComment{false};
    bool inMLineValue{false};

    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;
    int currentSectionIndex{0};

    std::string line_sep_chars{parentSeparatorChar, commentChar, valueDelimiter};
    while(getline(input, buffer)) {
        std::vector<std::string> items_buffer;
        std::string name;
        line = detail::trim_copy(buffer);
        std::size_t len = line.length();
        // lines have to be at least 3 characters to have any meaning to CLI just skip the rest
        if(len < 3) {
            continue;
        }
        if(line.compare(0, 3, multiline_string_quote) == 0 || line.compare(0, 3, multiline_literal_quote) == 0) {
            inMLineComment = true;
            auto cchar = line.front();
            while(inMLineComment) {
                if(getline(input, line)) {
                    detail::trim(line);
                } else {
                    break;
                }
                if(detail::hasMLString(line, cchar)) {
                    inMLineComment = false;
                }
            }
            continue;
        }
        if(line.front() == '[' && line.back() == ']') {
            if(currentSection != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
                output.back().name = "--";
            }
            currentSection = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(currentSection.size() > 1 && currentSection.front() == '[' && currentSection.back() == ']') {
                currentSection = currentSection.substr(1, currentSection.size() - 2);
            }
            if(detail::to_lower(currentSection) == "default") {
                currentSection = "default";
            } else {
                detail::checkParentSegments(output, currentSection, parentSeparatorChar);
            }
            inSection = false;
            if(currentSection == previousSection) {
                ++currentSectionIndex;
            } else {
                currentSectionIndex = 0;
                previousSection = currentSection;
            }
            continue;
        }

        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }
        std::size_t search_start = 0;
        if(line.find_first_of("\"'`") != std::string::npos) {
            while(search_start < line.size()) {
                auto test_char = line[search_start];
                if(test_char == '\"' || test_char == '\'' || test_char == '`') {
                    search_start = detail::close_sequence(line, search_start, line[search_start]);
                    ++search_start;
                } else if(test_char == valueDelimiter || test_char == commentChar) {
                    --search_start;
                    break;
                } else if(test_char == ' ' || test_char == '\t' || test_char == parentSeparatorChar) {
                    ++search_start;
                } else {
                    search_start = line.find_first_of(line_sep_chars, search_start);
                }
            }
        }
        // Find = in string, split and recombine
        auto delimiter_pos = line.find_first_of(valueDelimiter, search_start + 1);
        auto comment_pos = line.find_first_of(commentChar, search_start);
        if(comment_pos < delimiter_pos) {
            delimiter_pos = std::string::npos;
        }
        if(delimiter_pos != std::string::npos) {

            name = detail::trim_copy(line.substr(0, delimiter_pos));
            std::string item = detail::trim_copy(line.substr(delimiter_pos + 1, std::string::npos));
            bool mlquote =
                (item.compare(0, 3, multiline_literal_quote) == 0 || item.compare(0, 3, multiline_string_quote) == 0);
            if(!mlquote && comment_pos != std::string::npos) {
                auto citems = detail::split_up(item, commentChar);
                item = detail::trim_copy(citems.front());
            }
            if(mlquote) {
                // multiline string
                auto keyChar = item.front();
                item = buffer.substr(delimiter_pos + 1, std::string::npos);
                detail::ltrim(item);
                item.erase(0, 3);
                inMLineValue = true;
                bool lineExtension{false};
                bool firstLine = true;
                if(!item.empty() && item.back() == '\\') {
                    item.pop_back();
                    lineExtension = true;
                } else if(detail::hasMLString(item, keyChar)) {
                    // deal with the first line closing the multiline literal
                    item.pop_back();
                    item.pop_back();
                    item.pop_back();
                    if(keyChar == '\"') {
                        try {
                            item = detail::remove_escaped_characters(item);
                        } catch(const std::invalid_argument &iarg) {
                            throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                        }
                    }
                    inMLineValue = false;
                }
                while(inMLineValue) {
                    std::string l2;
                    if(!std::getline(input, l2)) {
                        break;
                    }
                    line = l2;
                    detail::rtrim(line);
                    if(detail::hasMLString(line, keyChar)) {
                        line.pop_back();
                        line.pop_back();
                        line.pop_back();
                        if(lineExtension) {
                            detail::ltrim(line);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        firstLine = false;
                        item += line;
                        inMLineValue = false;
                        if(!item.empty() && item.back() == '\n') {
                            item.pop_back();
                        }
                        if(keyChar == '\"') {
                            try {
                                item = detail::remove_escaped_characters(item);
                            } catch(const std::invalid_argument &iarg) {
                                throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                            }
                        }
                    } else {
                        if(lineExtension) {
                            detail::trim(l2);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        lineExtension = false;
                        firstLine = false;
                        if(!l2.empty() && l2.back() == '\\') {
                            lineExtension = true;
                            l2.pop_back();
                        }
                        item += l2;
                    }
                }
                items_buffer = {item};
            } else if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                if(item.back() == aEnd) {
                    items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
                } else {
                    items_buffer = detail::split_up(item.substr(1, std::string::npos), aSep);
                }
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item, '\0');
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line.substr(0, comment_pos));
            items_buffer = {"true"};
        }
        std::vector<std::string> parents;
        try {
            parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
            detail::process_quoted_string(name);
            // clean up quotes on the items and check for escaped strings
            for(auto &it : items_buffer) {
                detail::process_quoted_string(it, stringQuote, literalQuote);
            }
        } catch(const std::invalid_argument &ia) {
            throw CLI::ParseError(ia.what(), CLI::ExitCodes::InvalidError);
        }

        if(parents.size() > maximumLayers) {
            continue;
        }
        if(!configSection.empty() && !inSection) {
            if(parents.empty() || parents.front() != configSection) {
                continue;
            }
            if(configIndex >= 0 && currentSectionIndex != configIndex) {
                continue;
            }
            parents.erase(parents.begin());
            inSection = true;
        }
        auto match = detail::find_matching_config(output, parents, name, allowMultipleDuplicateFields);
        if(match != output.end()) {
            if((match->inputs.size() > 1 && items_buffer.size() > 1) || allowMultipleDuplicateFields) {
                // insert a separator if one is not already present
                if(!(match->inputs.back().empty() || items_buffer.front().empty() || match->inputs.back() == "%%" ||
                     items_buffer.front() == "%%")) {
                    match->inputs.emplace_back("%%");
                    match->multiline = true;
                }
            }
            match->inputs.insert(match->inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(currentSection != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(currentSection, ename, parentSeparatorChar);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}